

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_4::clear(Functions *gl,EGLint api,Vec4 *color,float depth,int stencil)

{
  NotSupportedError *this;
  allocator<char> local_49;
  string local_48;
  int local_28;
  float local_24;
  int stencil_local;
  float depth_local;
  Vec4 *color_local;
  Functions *pFStack_10;
  EGLint api_local;
  Functions *gl_local;
  
  local_28 = stencil;
  local_24 = depth;
  _stencil_local = color;
  color_local._4_4_ = api;
  pFStack_10 = gl;
  if (api == 4) {
    clearGLES2(gl,color,depth,stencil);
  }
  else {
    if (api != 0x40) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Unsupported API",&local_49);
      tcu::NotSupportedError::NotSupportedError(this,&local_48);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
      ;
    }
    clearGLES2(gl,color,depth,stencil);
  }
  return;
}

Assistant:

void clear (const glw::Functions& gl, EGLint api, const tcu::Vec4& color, const float depth, const int stencil)
{
	switch (api)
	{
		case EGL_OPENGL_ES2_BIT:		clearGLES2(gl, color, depth, stencil);		break;
		case EGL_OPENGL_ES3_BIT_KHR:	clearGLES2(gl, color, depth, stencil);		break;
		default:
			throw tcu::NotSupportedError("Unsupported API");
	}
}